

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O3

uint8_t plot::ansi::detail::find_color256(Color c)

{
  ulong uVar1;
  pair<plot::Color,_std::pair<int,_bool>_> *ppVar2;
  bool bVar3;
  Color32 CVar4;
  long lVar5;
  uint8_t uVar6;
  pair<plot::Color,_std::pair<int,_bool>_> *__it2;
  float in_XMM0_Da;
  float fVar7;
  float in_XMM0_Db;
  float in_XMM1_Da;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Color local_60;
  float local_50;
  int local_4c;
  ulong local_48;
  undefined1 local_40 [16];
  
  lVar5 = 0x18;
  __it2 = (pair<plot::Color,_std::pair<int,_bool>_> *)&palette;
  local_60.r = in_XMM0_Da;
  local_60.g = in_XMM0_Db;
  local_60.b = in_XMM1_Da;
  do {
    bVar3 = __gnu_cxx::__ops::
            _Iter_comp_iter<plot::ansi::detail::find_palette_entry(plot::Color)::{lambda(auto:1_const&,auto:2_const&)#1}>
            ::operator()(local_40,(pair<plot::Color,_std::pair<int,_bool>_> *)
                                  ((long)&palette + lVar5),__it2);
    ppVar2 = (pair<plot::Color,_std::pair<int,_bool>_> *)((long)&palette + lVar5);
    if (!bVar3) {
      ppVar2 = __it2;
    }
    __it2 = ppVar2;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x180);
  fVar7 = (__it2->first).r;
  local_4c = (__it2->second).first;
  bVar3 = (__it2->second).second;
  CVar4 = Color::color32(&local_60,'\x05',0xff);
  local_48 = (ulong)((uint)CVar4 >> 8);
  fVar8 = local_60.b * 0.11 + local_60.r * 0.3 + local_60.g * 0.59;
  fVar8 = (float)(-(uint)(0.0 <= fVar8) & (uint)fVar8);
  if (1.0 <= fVar8) {
    fVar8 = 1.0;
  }
  lVar5 = lroundf(fVar8 * 23.0);
  fVar9 = (fVar7 + local_60.r) * 0.5;
  fVar8 = local_60.g - (__it2->first).g;
  fVar7 = local_60.r - fVar7;
  fVar10 = local_60.b - (__it2->first).b;
  fVar7 = (3.0 - fVar9) * fVar10 * fVar10 + (fVar9 + 2.0) * fVar7 * fVar7 + fVar8 * 4.0 * fVar8;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  uVar1 = local_48;
  fVar8 = (float)((uint)CVar4 & 0xff) / 5.0;
  fVar10 = local_60.g - (float)((uint)local_48 & 0xff) / 5.0;
  fVar9 = (fVar8 + local_60.r) * 0.5;
  fVar8 = local_60.r - fVar8;
  fVar11 = local_60.b - (float)((uint)CVar4 >> 0x10 & 0xff) / 5.0;
  local_50 = (3.0 - fVar9) * fVar11 * fVar11 + (fVar9 + 2.0) * fVar8 * fVar8 + fVar10 * 4.0 * fVar10
  ;
  if (local_50 < 0.0) {
    local_50 = sqrtf(local_50);
  }
  else {
    local_50 = SQRT(local_50);
  }
  fVar8 = (float)((uint)lVar5 & 0xff) / 23.0;
  fVar9 = (fVar8 + local_60.r) * 0.5;
  fVar8 = (3.0 - fVar9) * (local_60.b - fVar8) * (local_60.b - fVar8) +
          (fVar9 + 2.0) * (local_60.r - fVar8) * (local_60.r - fVar8) +
          (local_60.g - fVar8) * 4.0 * (local_60.g - fVar8);
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  if ((fVar7 < local_50) || (fVar8 < local_50)) {
    if (fVar8 <= fVar7) {
      uVar6 = (char)lVar5 + 0xe8;
    }
    else {
      uVar6 = (char)local_4c + bVar3 * '\b';
    }
  }
  else {
    uVar6 = CVar4.b + CVar4.r * '$' + (char)uVar1 * '\x06' + '\x10';
  }
  return uVar6;
}

Assistant:

inline std::uint8_t find_color256(plot::Color c) {
            using utils::clamp;
            auto ansi_clr = find_palette_entry(c);
            auto color = c.color32(5);
            std::uint8_t gray = std::lround(clamp(0.3f*c.r + 0.59f*c.g + 0.11f*c.b, 0.0f, 1.0f)*23);

            auto ansi_dist = ansi_clr.first.distance(c);
            auto color_dist = plot::Color(color, 5).distance(c);
            auto gray_dist = plot::Color({ gray, gray, gray, 255 }, 23).distance(c);

            if (color_dist <= gray_dist && color_dist <= ansi_dist) {
                return 16 + 36*color.r + 6*color.g + color.b;
            } else if (gray_dist <= ansi_dist) {
                return gray + 0xe8;
            } else {
                return ansi_clr.second.first + 8*ansi_clr.second.second;
            }
        }